

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_137552::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  float fVar1;
  PixelType PVar2;
  size_t __n;
  bool bVar3;
  PixelType PVar4;
  ulong __n_00;
  Array2D<void_*> *pAVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  undefined4 *puVar14;
  int *piVar15;
  ChannelList *this;
  ChannelList *pCVar16;
  int *piVar17;
  void *pvVar18;
  void *pvVar19;
  ostream *poVar20;
  long lVar21;
  void *pvVar22;
  long *plVar23;
  void **ppvVar24;
  undefined4 uVar25;
  int iVar26;
  undefined7 in_register_00000009;
  char *pcVar27;
  long lVar28;
  long lVar29;
  int i;
  uint uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  char *pcVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  int j;
  long lVar42;
  long lVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auStack_378 [8];
  ulong local_370;
  long local_368;
  long local_360;
  DeepTiledInputFile file;
  Array<Imf_3_2::Array2D<void_*>_> data;
  long local_328;
  long local_320;
  int local_318;
  int local_2bc;
  string str;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar25 = (undefined4)CONCAT71(in_register_00000009,randomChannels);
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1b6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  Imf_3_2::DeepTiledInputFile::header();
  puVar10 = (undefined8 *)Imf_3_2::Header::displayWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar49 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar50 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar45._4_4_ = iVar49;
  auVar45._0_4_ = iVar49;
  auVar45._8_4_ = iVar50;
  auVar45._12_4_ = iVar50;
  iVar49 = movmskpd(uVar25,auVar45);
  if ((iVar49 != 3) ||
     (iVar50 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar51 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar46._4_4_ = iVar50, auVar46._0_4_ = iVar50, auVar46._8_4_ = iVar51, auVar46._12_4_ = iVar51
     , iVar50 = movmskpd((int)puVar11,auVar46), iVar50 != 3)) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bd,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::dataWindow();
  puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar50 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar51 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar47._4_4_ = iVar50;
  auVar47._0_4_ = iVar50;
  auVar47._8_4_ = iVar51;
  auVar47._12_4_ = iVar51;
  iVar49 = movmskpd(iVar49,auVar47);
  if ((iVar49 != 3) ||
     (iVar49 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar50 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar48._4_4_ = iVar49, auVar48._0_4_ = iVar49, auVar48._8_4_ = iVar50, auVar48._12_4_ = iVar50
     , iVar49 = movmskpd((int)puVar11,auVar48), iVar49 != 3)) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1be,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  local_370._0_4_ = *pfVar12;
  pfVar12 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if (((float)local_370 != *pfVar12) || (NAN((float)local_370) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bf,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar12 = (float *)Imf_3_2::Header::screenWindowCenter();
  pfVar13 = (float *)Imf_3_2::Header::screenWindowCenter();
  if ((((*pfVar12 != *pfVar13) || (NAN(*pfVar12) || NAN(*pfVar13))) || (pfVar12[1] != pfVar13[1]))
     || (NAN(pfVar12[1]) || NAN(pfVar13[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar14 = (undefined4 *)Imf_3_2::Header::screenWindowWidth();
  local_370 = CONCAT44(local_370._4_4_,*puVar14);
  pfVar12 = (float *)Imf_3_2::Header::screenWindowWidth();
  if (((float)local_370 != *pfVar12) || (NAN((float)local_370) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_2::Header::lineOrder();
  iVar49 = *piVar15;
  piVar15 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar49 != *piVar15) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_2::Header::compression();
  iVar49 = *piVar15;
  piVar15 = (int *)Imf_3_2::Header::compression();
  if (iVar49 != *piVar15) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = (ChannelList *)Imf_3_2::Header::channels();
  pCVar16 = (ChannelList *)Imf_3_2::Header::channels();
  cVar6 = Imf_3_2::ChannelList::operator==(this,pCVar16);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c4,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar10 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  puVar11 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  __n = puVar10[1];
  if ((__n != puVar11[1]) ||
     ((__n != 0 && (iVar49 = bcmp((void *)*puVar10,(void *)*puVar11,__n), iVar49 != 0)))) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c5,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_2::Header::tileDescription();
  piVar17 = (int *)Imf_3_2::Header::tileDescription();
  if ((((*piVar15 != *piVar17) || (piVar15[1] != piVar17[1])) || (piVar15[2] != piVar17[2])) ||
     (piVar15[3] != piVar17[3])) {
    __assert_fail("fileHeader.tileDescription () == header.tileDescription ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pvVar18 = operator_new__(0x2d0e4);
  uVar7 = random_int(3);
  uVar30 = channelCount + uVar7;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)(int)uVar30);
  if (0 < (int)uVar30) {
    lVar42 = 0;
    do {
      pAVar5 = data._data;
      pvVar19 = operator_new__(0x5a1c8);
      pvVar22 = *(void **)((long)&pAVar5->_data + lVar42);
      if (pvVar22 != (void *)0x0) {
        operator_delete__(pvVar22);
      }
      *(undefined8 *)((long)&pAVar5->_sizeX + lVar42) = 0xa9;
      *(undefined8 *)((long)&pAVar5->_sizeY + lVar42) = 0x111;
      *(void **)((long)&pAVar5->_data + lVar42) = pvVar19;
      lVar42 = lVar42 + 0x18;
    } while ((ulong)uVar30 * 0x18 != lVar42);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  if (relativeCoords) {
    lVar42 = 0;
  }
  else {
    lVar42 = (long)DAT_001f05b4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar18 + lVar42 * -4),4,0x444,1,1,0.0,relativeCoords,
             relativeCoords);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  __n_00 = (ulong)(uint)channelCount;
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    uVar38 = 0;
    lVar31 = 0x10;
    local_370 = lVar42 * -8;
    iVar49 = 0;
    do {
      if (randomChannels) {
        iVar50 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar38] = iVar50;
        if (iVar50 == 1) goto LAB_0015720b;
      }
      else {
LAB_0015720b:
        PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar38 * 4);
        PVar4 = (uint)(PVar2 != UINT) * 3;
        if (PVar2 == HALF) {
          PVar4 = PVar2;
        }
        if (PVar2 == FLOAT) {
          PVar4 = PVar2;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,(int)uVar38);
        std::__cxx11::stringbuf::str();
        iVar50 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
        uVar37 = (ulong)(iVar50 == 0) << 2;
        if (iVar50 == 1) {
          uVar37 = 2;
        }
        if (iVar50 == 2) {
          uVar37 = 4;
        }
        Imf_3_2::DeepSlice::DeepSlice
                  ((DeepSlice *)&box,PVar4,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar31) + local_370),8,0x888,
                   uVar37,1,1,0.0,relativeCoords,relativeCoords);
        Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar49 = iVar49 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      uVar38 = uVar38 + 1;
      lVar31 = lVar31 + 0x18;
    } while (__n_00 != uVar38);
    if (iVar49 != 0) {
      if (0 < (int)uVar7) {
        lVar42 = __n_00 * 0x18;
        uVar38 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar20 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar42) + local_370),8,0x888,4,
                     1,1,0.0,relativeCoords,relativeCoords);
          Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_138);
          uVar38 = uVar38 + 1;
          lVar42 = lVar42 + 0x18;
        } while (uVar7 != uVar38);
      }
      Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      pcVar27 = "per-tile ";
      if (relativeCoords) {
        pcVar27 = "per-tile with relative coordinates ";
      }
      lVar42 = 9;
      if (relativeCoords) {
        lVar42 = 0x23;
      }
      pcVar35 = "bulk ";
      if (!bulkRead) {
        pcVar35 = pcVar27;
      }
      lVar31 = 5;
      if (!bulkRead) {
        lVar31 = lVar42;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar35,lVar31);
      std::ostream::flush();
      lVar42 = (ulong)uVar7 * 0x18;
      local_368 = 0;
      while (iVar49 = Imf_3_2::DeepTiledInputFile::numYLevels(), local_368 < iVar49) {
        local_360 = 0;
        while( true ) {
          iVar49 = Imf_3_2::DeepTiledInputFile::numXLevels();
          if (iVar49 <= local_360) break;
          Imf_3_2::DeepTiledInputFile::dataWindowForLevel((int)&ss,(int)&file);
          if (bulkRead) {
            iVar49 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file);
            iVar50 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
                      ((int)&file,0,iVar49 + -1,0,iVar50 + -1,(int)local_360);
            for (iVar49 = 0;
                iVar50 = Imf_3_2::DeepTiledInputFile::numYTiles((int)auStack_378 + 0x20),
                iVar49 < iVar50; iVar49 = iVar49 + 1) {
              for (iVar50 = 0; iVar51 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file),
                  iVar50 < iVar51; iVar50 = iVar50 + 1) {
                Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar50,iVar49);
                iVar9 = box.max.x;
                iVar51 = box.min.x;
                local_320 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar31 = (long)box.min.x;
                  lVar28 = (long)_ss;
                  lVar29 = DAT_001f05f0 * local_368;
                  iVar8 = box.max.x + 1;
                  iVar34 = box.max.y + 1;
                  do {
                    if (iVar51 <= iVar9) {
                      lVar43 = local_320 - local_1b4;
                      lVar36 = lVar31;
                      do {
                        lVar32 = lVar36 - lVar28;
                        uVar30 = *(uint *)((long)pvVar18 + lVar32 * 4 + lVar43 * 0x444);
                        uVar38 = (ulong)uVar30;
                        lVar21 = lVar29 * 0x18 + DAT_001f05f8;
                        if (uVar30 != *(uint *)(*(long *)(lVar21 + 8 + local_360 * 0x18) * lVar43 *
                                                4 + *(long *)(lVar21 + 0x10 + local_360 * 0x18) +
                                               lVar32 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x253,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001f05d8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar38 * 2;
                          lVar40 = 4;
                          uVar37 = 0;
                          lVar21 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar26 = *(int *)(lVar21 + uVar37 * 4);
                            if (iVar26 == 0) {
                              pvVar22 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar26 == 1) {
                              pvVar22 = operator_new__(local_370);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar26 == 2) {
                              pvVar22 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            uVar37 = uVar37 + 1;
                            lVar40 = lVar40 + 6;
                          } while (uVar37 < (ulong)(DAT_001f05d8 - lVar21 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar21 = 0;
                          do {
                            pvVar22 = operator_new__(uVar38 << 2);
                            uVar37 = (ulong)(DAT_001f05d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar37]._sizeY + lVar21) * lVar43
                                       * 8 + *(long *)((long)&data._data[uVar37]._data + lVar21) +
                                      lVar32 * 8) = pvVar22;
                            lVar21 = lVar21 + 0x18;
                          } while (lVar42 != lVar21);
                        }
                        lVar36 = lVar36 + 1;
                      } while (iVar8 != (int)lVar36);
                    }
                    local_320 = local_320 + 1;
                  } while (iVar34 != (int)local_320);
                }
              }
            }
            iVar49 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file);
            iVar50 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_2::DeepTiledInputFile::readTiles
                      ((int)&file,0,iVar49 + -1,0,iVar50 + -1,(int)local_360);
          }
          else if (relativeCoords) {
            for (local_318 = 0; iVar49 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file),
                local_318 < iVar49; local_318 = local_318 + 1) {
              for (local_2bc = 0; iVar49 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file),
                  local_2bc < iVar49; local_2bc = local_2bc + 1) {
                Imf_3_2::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,local_2bc,local_318,(int)local_360);
                Imf_3_2::DeepTiledInputFile::dataWindowForTile
                          ((int)&box,(int)&file,local_2bc,local_318);
                iVar50 = box.max.x;
                iVar49 = box.min.x;
                lVar31 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar28 = (long)box.min.x;
                  lVar29 = (long)_ss;
                  lVar36 = DAT_001f05f0 * local_368;
                  iVar9 = box.max.x + 1;
                  iVar51 = box.max.y + 1;
                  local_328 = lVar31;
                  do {
                    if (iVar49 <= iVar50) {
                      lVar21 = local_328 - lVar31;
                      lVar43 = lVar28;
                      do {
                        lVar40 = lVar43 - lVar28;
                        uVar30 = *(uint *)((long)pvVar18 + lVar40 * 4 + lVar21 * 0x444);
                        uVar38 = (ulong)uVar30;
                        lVar32 = lVar36 * 0x18 + DAT_001f05f8;
                        if (uVar30 != *(uint *)(*(long *)(lVar32 + 8 + local_360 * 0x18) *
                                                (local_328 - local_1b4) * 4 +
                                                *(long *)(lVar32 + 0x10 + local_360 * 0x18) +
                                               (lVar43 - lVar29) * 4)) {
                          __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x2be,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001f05d8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar38 * 2;
                          lVar41 = 4;
                          uVar37 = 0;
                          lVar32 = (anonymous_namespace)::channelTypes;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar37] == 1)) {
                              iVar34 = *(int *)(lVar32 + uVar37 * 4);
                              if (iVar34 == 0) {
                                pvVar22 = operator_new__(uVar38 * 4);
                                *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                          lVar40 * 8) = pvVar22;
                                iVar34 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                                lVar32 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar34 == 1) {
                                pvVar22 = operator_new__(local_370);
                                *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                          lVar40 * 8) = pvVar22;
                                iVar34 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                                lVar32 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar34 == 2) {
                                pvVar22 = operator_new__(uVar38 * 4);
                                *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                          lVar40 * 8) = pvVar22;
                                lVar32 = (anonymous_namespace)::channelTypes;
                              }
                            }
                            uVar37 = uVar37 + 1;
                            lVar41 = lVar41 + 6;
                          } while (uVar37 < (ulong)(DAT_001f05d8 - lVar32 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar32 = 0;
                          do {
                            pvVar22 = operator_new__(uVar38 << 2);
                            uVar37 = (ulong)(DAT_001f05d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar37]._sizeY + lVar32) * lVar21
                                       * 8 + *(long *)((long)&data._data[uVar37]._data + lVar32) +
                                      lVar40 * 8) = pvVar22;
                            lVar32 = lVar32 + 0x18;
                          } while (lVar42 != lVar32);
                        }
                        lVar43 = lVar43 + 1;
                      } while (iVar9 != (int)lVar43);
                    }
                    local_328 = local_328 + 1;
                  } while (iVar51 != (int)local_328);
                }
                Imf_3_2::DeepTiledInputFile::readTile((int)&file,local_2bc,local_318,(int)local_360)
                ;
                iVar50 = box.max.y;
                iVar51 = box.max.x;
                iVar49 = box.min.y;
                if (box.min.y <= box.max.y) {
                  do {
                    lVar31 = (anonymous_namespace)::channelTypes;
                    lVar28 = DAT_001f05d8;
                    lVar29 = DAT_001f05d8;
                    iVar9 = box.min.x;
                    if (box.min.x <= iVar51) {
                      do {
                        lVar43 = (long)iVar49 - (long)box.min.y;
                        lVar21 = (long)iVar9 - (long)box.min.x;
                        lVar36 = lVar31;
                        if (lVar29 != lVar31) {
                          iVar50 = iVar49 - local_1b4;
                          iVar51 = iVar9 - _ss;
                          iVar34 = (iVar50 * 0x111 + iVar51) % 0x801;
                          local_370 = CONCAT44(local_370._4_4_,(float)iVar34);
                          uVar38 = 0;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar38] == 1)) {
                              lVar28 = (long)*(int *)((long)pvVar18 + lVar21 * 4 + lVar43 * 0x444);
                              iVar8 = *(int *)(lVar31 + uVar38 * 4);
                              if (0 < lVar28) {
                                pvVar22 = data._data[uVar38]._data
                                          [data._data[uVar38]._sizeY * lVar43 + lVar21];
                                lVar31 = 0;
                                do {
                                  if (iVar8 == 2) {
                                    fVar44 = *(float *)((long)pvVar22 + lVar31 * 4);
                                    if ((fVar44 != (float)local_370) ||
                                       (NAN(fVar44) || NAN((float)local_370))) {
                                      poVar20 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar51);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", ",2);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar50);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20," error, should be ",0x12);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar34);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", is ",5);
                                      poVar20 = std::ostream::_M_insert<double>
                                                          ((double)*(float *)((long)pvVar22 +
                                                                             lVar31 * 4));
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar20 + -0x18) +
                                                      (char)poVar20);
                                      std::ostream::put((char)poVar20);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar44 = *(float *)((long)pvVar22 + lVar31 * 4);
                                    }
                                    if ((fVar44 != (float)local_370) ||
                                       (NAN(fVar44) || NAN((float)local_370))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x1a9,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if (iVar8 == 1) {
                                    fVar44 = *(float *)(_imath_half_to_float_table +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar22 + lVar31 * 2) * 4);
                                    if ((fVar44 != (float)local_370) ||
                                       (NAN(fVar44) || NAN((float)local_370))) {
                                      poVar20 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar51);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", ",2);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar50);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20," error, should be ",0x12);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar34);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", is ",5);
                                      plVar23 = (long *)::operator<<(poVar20,(half)*(uint16_t *)
                                                                                    ((long)pvVar22 +
                                                                                    lVar31 * 2));
                                      std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) +
                                                      (char)plVar23);
                                      std::ostream::put((char)plVar23);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar44 = *(float *)(_imath_half_to_float_table +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar22 + lVar31 * 2) * 4);
                                    }
                                    if ((fVar44 != (float)local_370) ||
                                       (NAN(fVar44) || NAN((float)local_370))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x19f,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if ((iVar8 == 0) &&
                                          (*(int *)((long)pvVar22 + lVar31 * 4) != iVar34)) {
                                    poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar51)
                                    ;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar20,", ",2);
                                    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar50);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar20," error, should be ",0x12);
                                    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar34);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar20,", is ",5);
                                    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20)
                                    ;
                                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18)
                                                    + (char)poVar20);
                                    std::ostream::put((char)poVar20);
                                    std::ostream::flush();
                                    std::ostream::flush();
                                    if (*(int *)((long)pvVar22 + lVar31 * 4) != iVar34) {
                                      __assert_fail(
                                                  "value[l] == static_cast<unsigned int> ((dwy * width + dwx) % 2049)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x195,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  lVar31 = lVar31 + 1;
                                } while (lVar28 != lVar31);
                                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar8 == 0) {
                                if (data._data[uVar38]._data
                                    [data._data[uVar38]._sizeY * lVar43 + lVar21] == (void *)0x0)
                                goto LAB_001580f3;
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar43 + lVar21]);
                                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar8 == 1) {
                                if (data._data[uVar38]._data
                                    [data._data[uVar38]._sizeY * lVar43 + lVar21] == (void *)0x0)
                                goto LAB_001580f3;
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar43 + lVar21]);
                                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                              if ((iVar8 == 2) &&
                                 (data._data[uVar38]._data
                                  [data._data[uVar38]._sizeY * lVar43 + lVar21] != (void *)0x0)) {
                                operator_delete__(data._data[uVar38]._data
                                                  [data._data[uVar38]._sizeY * lVar43 + lVar21]);
                                lVar31 = (anonymous_namespace)::channelTypes;
                              }
                            }
LAB_001580f3:
                            uVar38 = uVar38 + 1;
                            lVar28 = DAT_001f05d8;
                            lVar36 = DAT_001f05d8;
                          } while (uVar38 < (ulong)(DAT_001f05d8 - lVar31 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar29 = 0;
                          lVar36 = lVar28;
                          do {
                            uVar38 = (ulong)(lVar36 - lVar31) >> 2;
                            pvVar22 = *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar29
                                                          ) * (long)(int)lVar43 * 8 +
                                                 *(long *)((long)&data._data[uVar38]._data + lVar29)
                                                + (long)(int)lVar21 * 8);
                            if (pvVar22 != (void *)0x0) {
                              operator_delete__(pvVar22);
                              lVar31 = (anonymous_namespace)::channelTypes;
                              lVar28 = DAT_001f05d8;
                              lVar36 = DAT_001f05d8;
                            }
                            lVar29 = lVar29 + 0x18;
                          } while (lVar42 != lVar29);
                        }
                        bVar3 = iVar9 < box.max.x;
                        lVar29 = lVar36;
                        iVar50 = box.max.y;
                        iVar51 = box.max.x;
                        iVar9 = iVar9 + 1;
                      } while (bVar3);
                    }
                    bVar3 = iVar49 < iVar50;
                    iVar49 = iVar49 + 1;
                  } while (bVar3);
                }
              }
            }
          }
          else {
            for (iVar49 = 0; iVar50 = Imf_3_2::DeepTiledInputFile::numYTiles((int)&file),
                iVar49 < iVar50; iVar49 = iVar49 + 1) {
              for (iVar50 = 0; iVar51 = Imf_3_2::DeepTiledInputFile::numXTiles((int)&file),
                  iVar50 < iVar51; iVar50 = iVar50 + 1) {
                Imf_3_2::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,iVar50,iVar49,(int)local_360);
                Imf_3_2::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar50,iVar49);
                iVar9 = box.max.x;
                iVar51 = box.min.x;
                local_320 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar31 = (long)box.min.x;
                  lVar28 = (long)_ss;
                  lVar29 = DAT_001f05f0 * local_368;
                  iVar8 = box.max.x + 1;
                  iVar34 = box.max.y + 1;
                  do {
                    if (iVar51 <= iVar9) {
                      lVar43 = local_320 - local_1b4;
                      lVar36 = lVar31;
                      do {
                        lVar32 = lVar36 - lVar28;
                        uVar30 = *(uint *)((long)pvVar18 + lVar32 * 4 + lVar43 * 0x444);
                        uVar38 = (ulong)uVar30;
                        lVar21 = lVar29 * 0x18 + DAT_001f05f8;
                        if (uVar30 != *(uint *)(*(long *)(lVar21 + 8 + local_360 * 0x18) * lVar43 *
                                                4 + *(long *)(lVar21 + 0x10 + local_360 * 0x18) +
                                               lVar32 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x28c,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001f05d8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar38 * 2;
                          lVar40 = 4;
                          uVar37 = 0;
                          lVar21 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar26 = *(int *)(lVar21 + uVar37 * 4);
                            if (iVar26 == 0) {
                              pvVar22 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar26 == 1) {
                              pvVar22 = operator_new__(local_370);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              iVar26 = *(int *)((anonymous_namespace)::channelTypes + uVar37 * 4);
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar26 == 2) {
                              pvVar22 = operator_new__(uVar38 * 4);
                              *(void **)(*(long *)((long)data._data + lVar40 * 4 + -8) * lVar43 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar40 * 4) +
                                        lVar32 * 8) = pvVar22;
                              lVar21 = (anonymous_namespace)::channelTypes;
                            }
                            uVar37 = uVar37 + 1;
                            lVar40 = lVar40 + 6;
                          } while (uVar37 < (ulong)(DAT_001f05d8 - lVar21 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar21 = 0;
                          do {
                            pvVar22 = operator_new__(uVar38 << 2);
                            uVar37 = (ulong)(DAT_001f05d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar37]._sizeY + lVar21) * lVar43
                                       * 8 + *(long *)((long)&data._data[uVar37]._data + lVar21) +
                                      lVar32 * 8) = pvVar22;
                            lVar21 = lVar21 + 0x18;
                          } while (lVar42 != lVar21);
                        }
                        lVar36 = lVar36 + 1;
                      } while (iVar8 != (int)lVar36);
                    }
                    local_320 = local_320 + 1;
                  } while (iVar34 != (int)local_320);
                }
                Imf_3_2::DeepTiledInputFile::readTile((int)&file,iVar50,iVar49,(int)local_360);
              }
            }
          }
          if (!relativeCoords) {
            uVar38 = 0;
            while (iVar49 = Imf_3_2::DeepTiledInputFile::levelHeight((int)&file),
                  (long)uVar38 < (long)iVar49) {
              uVar37 = uVar38;
              local_370 = uVar38;
              for (lVar31 = 0; iVar49 = Imf_3_2::DeepTiledInputFile::levelWidth((int)&file),
                  lVar31 < iVar49; lVar31 = lVar31 + 1) {
                if (0 < channelCount) {
                  iVar49 = (int)lVar31;
                  uVar30 = (uint)(iVar49 + (int)uVar38 * 0x111) % 0x801;
                  fVar44 = (float)uVar30;
                  uVar33 = 0;
                  do {
                    if (((!randomChannels) ||
                        (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar33] == 1)) &&
                       (*(int *)((long)pvVar18 + lVar31 * 4 + uVar38 * 0x444) != 0)) {
                      uVar39 = 0;
                      do {
                        iVar50 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                        if (iVar50 == 0) {
                          pvVar22 = data._data[uVar33]._data
                                    [data._data[uVar33]._sizeY * uVar37 + lVar31];
                          if (*(uint *)((long)pvVar22 + uVar39 * 4) != uVar30) {
                            poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar49);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)uVar37);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20," error, should be ",0x12);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar30);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                            (char)poVar20);
                            std::ostream::put((char)poVar20);
                            std::ostream::flush();
                            std::ostream::flush();
                            if (*(uint *)((long)pvVar22 + uVar39 * 4) != uVar30) {
                              __assert_fail("value[l] == static_cast<unsigned int> ( i * width + j) % 2049"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                            ,0x323,
                                            "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                           );
                            }
                          }
                          iVar50 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                        }
                        if (iVar50 == 1) {
                          ppvVar24 = data._data[uVar33]._data;
                          lVar28 = data._data[uVar33]._sizeY * uVar37;
                          pvVar22 = ppvVar24[lVar28 + lVar31];
                          fVar1 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)((long)pvVar22 + uVar39 * 2) * 4);
                          if ((fVar1 != fVar44) || (NAN(fVar1) || NAN(fVar44))) {
                            poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar49);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_370);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20," error, should be ",0x12);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar30);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                            plVar23 = (long *)::operator<<(poVar20,(half)*(uint16_t *)
                                                                          ((long)pvVar22 +
                                                                          uVar39 * 2));
                            std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23)
                            ;
                            std::ostream::put((char)plVar23);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar24 = data._data[uVar33]._data;
                            lVar28 = data._data[uVar33]._sizeY * local_370;
                          }
                          fVar1 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)
                                                    ((long)ppvVar24[lVar28 + lVar31] + uVar39 * 2) *
                                            4);
                          if ((fVar1 != fVar44) || (NAN(fVar1) || NAN(fVar44))) {
                            __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x330,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          iVar50 = *(int *)((anonymous_namespace)::channelTypes + uVar33 * 4);
                          uVar37 = local_370;
                        }
                        if (iVar50 == 2) {
                          ppvVar24 = data._data[uVar33]._data;
                          lVar28 = data._data[uVar33]._sizeY * uVar37;
                          pvVar22 = ppvVar24[lVar28 + lVar31];
                          fVar1 = *(float *)((long)pvVar22 + uVar39 * 4);
                          if ((fVar1 != fVar44) || (NAN(fVar1) || NAN(fVar44))) {
                            poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar49);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_370);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20," error, should be ",0x12);
                            poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar30);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                            poVar20 = std::ostream::_M_insert<double>
                                                ((double)*(float *)((long)pvVar22 + uVar39 * 4));
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                            (char)poVar20);
                            std::ostream::put((char)poVar20);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar24 = data._data[uVar33]._data;
                            lVar28 = data._data[uVar33]._sizeY * local_370;
                          }
                          fVar1 = *(float *)((long)ppvVar24[lVar28 + lVar31] + uVar39 * 4);
                          if ((fVar1 != fVar44) || (uVar37 = local_370, NAN(fVar1) || NAN(fVar44)))
                          {
                            __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x33d,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                        uVar39 = uVar39 + 1;
                      } while (uVar39 < *(uint *)((long)pvVar18 + lVar31 * 4 + uVar38 * 0x444));
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != __n_00);
                }
              }
              uVar38 = uVar37 + 1;
            }
            for (lVar31 = 0; iVar49 = Imf_3_2::DeepTiledInputFile::levelHeight((int)&file),
                lVar31 < iVar49; lVar31 = lVar31 + 1) {
              for (lVar28 = 0; iVar49 = Imf_3_2::DeepTiledInputFile::levelWidth((int)&file),
                  lVar28 < iVar49; lVar28 = lVar28 + 1) {
                if (0 < channelCount) {
                  lVar36 = 4;
                  uVar38 = 0;
                  lVar29 = (anonymous_namespace)::channelTypes;
                  do {
                    iVar49 = *(int *)(lVar29 + uVar38 * 4);
                    if (iVar49 == 0) {
                      pvVar22 = *(void **)(*(long *)((long)data._data + lVar36 * 4 + -8) * lVar31 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar36 * 4) +
                                          lVar28 * 8);
                      if (pvVar22 != (void *)0x0) {
                        operator_delete__(pvVar22);
                        iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                        lVar29 = (anonymous_namespace)::channelTypes;
                        goto LAB_00158aaa;
                      }
                    }
                    else {
LAB_00158aaa:
                      if (iVar49 == 1) {
                        pvVar22 = *(void **)(*(long *)((long)data._data + lVar36 * 4 + -8) * lVar31
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar36 * 4) + lVar28 * 8);
                        if (pvVar22 == (void *)0x0) goto LAB_00158b0e;
                        operator_delete__(pvVar22);
                        iVar49 = *(int *)((anonymous_namespace)::channelTypes + uVar38 * 4);
                        lVar29 = (anonymous_namespace)::channelTypes;
                      }
                      if ((iVar49 == 2) &&
                         (pvVar22 = *(void **)(*(long *)((long)data._data + lVar36 * 4 + -8) *
                                               lVar31 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar36 * 4) +
                                              lVar28 * 8), pvVar22 != (void *)0x0)) {
                        operator_delete__(pvVar22);
                        lVar29 = (anonymous_namespace)::channelTypes;
                      }
                    }
LAB_00158b0e:
                    uVar38 = uVar38 + 1;
                    lVar36 = lVar36 + 6;
                  } while (__n_00 != uVar38);
                }
                if (0 < (int)uVar7) {
                  lVar43 = 0;
                  lVar29 = DAT_001f05d8;
                  lVar36 = (anonymous_namespace)::channelTypes;
                  do {
                    uVar38 = (ulong)(lVar29 - lVar36) >> 2;
                    pvVar22 = *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar43) *
                                         lVar31 * 8 +
                                         *(long *)((long)&data._data[uVar38]._data + lVar43) +
                                        lVar28 * 8);
                    if (pvVar22 != (void *)0x0) {
                      operator_delete__(pvVar22);
                      lVar29 = DAT_001f05d8;
                      lVar36 = (anonymous_namespace)::channelTypes;
                    }
                    lVar43 = lVar43 + 0x18;
                  } while (lVar42 != lVar43);
                }
              }
            }
          }
          local_360 = local_360 + 1;
        }
        local_368 = local_368 + 1;
      }
      goto LAB_00158bd4;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_00158bd4:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar18);
  Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile(&file);
  return;
}

Assistant:

void
readFile (
    int                channelCount,
    bool               bulkRead,
    bool               relativeCoords,
    bool               randomChannels,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str (), 4);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());
    assert (fileHeader.tileDescription () == header.tileDescription ());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&localSampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    vector<int> read_channel (channelCount);
    int         channels_added = 0;
    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str,
                DeepSlice (
                    type,
                    (char*) (&data[i][0][0] - memOffset),
                    pointerSize * 1,
                    pointerSize * width,
                    sampleSize,
                    1,
                    1,
                    0,
                    relativeCoords,
                    relativeCoords));
            channels_added++;
        }
    }
    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i + channelCount][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);

                for (int i = 0; i < file.numYTiles (ly); i++)
                {
                    for (int j = 0; j < file.numXTiles (lx); j++)
                    {
                        Box2i box = file.dataWindowForTile (j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert (
                                    localSampleCount[dwy][dwx] ==
                                    sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size ();
                                     k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int
                                            [localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[localSampleCount[dwy]
                                                                     [dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[localSampleCount[dwy]
                                                                      [dwx]];
                                }

                                for (int f = 0; f < fillChannels; ++f)
                                {
                                    data[f + channelTypes.size ()][dwy][dwx] =
                                        new float[localSampleCount[dwy][dwx]];
                                }
                            }
                    }
                }

                file.readTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert (
                                        localSampleCount[dwy][dwx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[localSampleCount[dwy]
                                                                         [dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][dwy]
                                            [dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;
                                    assert (
                                        localSampleCount[ty][tx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            if (channelTypes[k] == 0)
                                                data[k][ty][tx] =
                                                    new unsigned int
                                                        [localSampleCount[ty]
                                                                         [tx]];
                                            if (channelTypes[k] == 1)
                                                data[k][ty][tx] = new half
                                                    [localSampleCount[ty][tx]];
                                            if (channelTypes[k] == 2)
                                                data[k][ty][tx] = new float
                                                    [localSampleCount[ty][tx]];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][ty][tx] =
                                            new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            checkValue (
                                                data[k][ty][tx],
                                                localSampleCount[ty][tx],
                                                channelTypes[k],
                                                dwx,
                                                dwy);
                                            if (channelTypes[k] == 0)
                                                delete[](unsigned int*)
                                                    data[k][ty][tx];
                                            if (channelTypes[k] == 1)
                                                delete[](half*) data[k][ty][tx];
                                            if (channelTypes[k] == 2)
                                                delete[](float*)
                                                    data[k][ty][tx];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        delete[](float*)
                                            data[f + channelTypes.size ()][ty]
                                                [tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (!randomChannels || read_channel[k] == 1)
                            {
                                for (unsigned int l = 0;
                                     l < localSampleCount[i][j];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value =
                                            (unsigned int*) (data[k][i][j]);
                                        if (value[l] !=
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            value[l] ==
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((half*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((float*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
                        for (int f = 0; f < fillChannels; ++f)
                        {
                            delete[](float*)
                                data[f + channelTypes.size ()][i][j];
                        }
                    }
            }
        }
}